

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator+(unsigned_long u,sc_signed *v)

{
  small_type vs;
  sc_digit *in_RDX;
  sc_signed *in_RSI;
  sc_signed *in_RDI;
  int in_stack_00000010;
  int in_stack_00000018;
  sc_digit *in_stack_00000020;
  sc_digit ud [3];
  small_type us;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  sc_digit *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  sc_digit *in_stack_ffffffffffffffd8;
  sc_signed *psVar1;
  
  if (in_RSI == (sc_signed *)0x0) {
    sc_signed::sc_signed(in_RDI,in_RDI);
  }
  else {
    psVar1 = in_RDI;
    vs = get_sign<unsigned_long>
                   ((unsigned_long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    from_uint<unsigned_long>
              (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (in_RDX[2] == 0) {
      sc_signed::sc_signed
                (in_RSI,(small_type)((ulong)in_RDX >> 0x20),(int)in_RDX,vs,in_stack_ffffffffffffffd8
                 ,SUB81((ulong)in_RDI >> 0x38,0));
    }
    else {
      add_signed_friend((small_type)((ulong)psVar1 >> 0x20),(int)psVar1,(int)((ulong)in_RSI >> 0x20)
                        ,in_RDX,vs,in_stack_00000010,in_stack_00000018,in_stack_00000020);
    }
  }
  return in_RDI;
}

Assistant:

sc_signed
operator+(unsigned long u, const sc_signed &v)
{

  if (u == 0) // case 1
    return sc_signed(v);

  CONVERT_LONG(u);

  if (v.sgn == SC_ZERO)  // case 2
    return sc_signed(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud, false);

  // cases 3 and 4
  return add_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}